

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

array<float,_3>
pbrt::SampleSphericalTriangle(array<pbrt::Point3<float>,_3> *v,Point3f p,Point2f u,Float *pdf)

{
  Vector3<float> v_00;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Point3<float> p_00;
  Point3<float> p_01;
  Point3<float> p_02;
  Vector3<float> c_00;
  Vector3<float> c_01;
  Point3<float> p_03;
  Point3<float> p_04;
  Point3<float> p_05;
  Vector3<float> w_00;
  Vector3<float> w_01;
  Vector3<float> w_02;
  Vector3<float> w_03;
  Vector3<float> w_04;
  Tuple3<pbrt::Vector3,_float> t;
  Tuple3<pbrt::Vector3,_float> t_00;
  Tuple3<pbrt::Vector3,_float> t_01;
  Tuple3<pbrt::Vector3,_float> t_02;
  undefined1 auVar1 [16];
  initializer_list<float> v_05;
  initializer_list<float> v_06;
  Vector3<float> v_07;
  Vector3<float> v_08;
  Vector3<float> v_09;
  Vector3<float> v_10;
  Vector3<float> v_11;
  Vector3<float> v_12;
  Vector3<float> v_13;
  Vector3<float> v_14;
  Vector3<float> v_15;
  Vector3<float> v_16;
  Vector3<float> v_17;
  Vector3<float> v_18;
  Vector3<float> v_19;
  undefined1 auVar2 [16];
  Vector3<float> w_05;
  Vector3<float> w_06;
  Vector3<float> w_07;
  Vector3<float> v_20;
  Vector3<float> v_21;
  Vector3<float> v_22;
  Vector3<float> v2;
  Vector3<float> v2_00;
  Vector3<float> v2_01;
  Vector3<float> v1;
  Vector3<float> v1_00;
  Vector3<float> v1_01;
  Vector3<float> w_08;
  Vector3<float> v_23;
  Vector3<float> w_09;
  Vector3<float> v_24;
  Vector3<float> w_10;
  Vector3<float> v_25;
  Vector3<float> w_11;
  Vector3<float> v_26;
  undefined8 uVar3;
  float fVar4;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar5;
  int iVar6;
  float *pfVar7;
  Point3<float> *pPVar8;
  float *in_RSI;
  array<pbrt::Point3<float>,_3> *in_RDI;
  long *in_FS_OFFSET;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  undefined8 uVar15;
  undefined8 uVar44;
  undefined1 in_ZMM0 [64];
  undefined1 auVar45 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var [56];
  undefined1 auVar29 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined4 in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  Vector3<float> VVar46;
  array<float,_3> aVar47;
  Float b2;
  Float b1;
  Vector3f s;
  Float invDivisor;
  Float divisor;
  Vector3f s1;
  Vector3f e2;
  Vector3f e1;
  Vector3f w;
  Float sinTheta;
  Float cosTheta;
  Vector3f cp;
  Float sinBp;
  Float cosBp;
  Float k2;
  Float k1;
  Float cosPhi;
  Float sinPhi;
  Float sinAlpha;
  Float cosAlpha;
  Float A;
  Float Ap_pi;
  Float A_pi;
  Float gamma;
  Float beta;
  Float alpha;
  Vector3f n_ca;
  Vector3f n_bc;
  Vector3f n_ab;
  int vb_2;
  float va_2;
  int vb_1;
  float va_1;
  int vb;
  float va;
  Vector3f c;
  Vector3f b;
  Vector3f a;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffff440;
  float in_stack_fffffffffffff448;
  float in_stack_fffffffffffff44c;
  float in_stack_fffffffffffff450;
  float in_stack_fffffffffffff454;
  undefined4 in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff464;
  float in_stack_fffffffffffff468;
  float fVar48;
  float in_stack_fffffffffffff46c;
  float fVar49;
  float in_stack_fffffffffffff470;
  float fVar50;
  undefined4 uVar51;
  int i;
  undefined4 in_stack_fffffffffffff480;
  float fVar52;
  undefined4 in_stack_fffffffffffff484;
  float in_stack_fffffffffffff488;
  float fVar53;
  undefined4 in_stack_fffffffffffff48c;
  float in_stack_fffffffffffff490;
  int in_stack_fffffffffffff494;
  char *in_stack_fffffffffffff498;
  undefined8 in_stack_fffffffffffff4a0;
  LogLevel level;
  char *in_stack_fffffffffffff4a8;
  size_t i_00;
  undefined8 in_stack_fffffffffffff4b0;
  LogLevel level_00;
  undefined4 in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c4;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4cc;
  undefined4 in_stack_fffffffffffff4d0;
  undefined4 in_stack_fffffffffffff4d4;
  int *in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4f8;
  float in_stack_fffffffffffff500;
  undefined8 in_stack_fffffffffffff518;
  float in_stack_fffffffffffff520;
  undefined8 in_stack_fffffffffffff528;
  float in_stack_fffffffffffff530;
  undefined8 in_stack_fffffffffffff548;
  float in_stack_fffffffffffff550;
  undefined4 local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 *local_9d8;
  undefined8 local_9d0;
  __0 local_9b1;
  undefined8 local_9b0;
  float local_9a8;
  undefined8 local_9a0;
  float local_998;
  undefined8 local_990;
  float local_988;
  undefined8 local_980;
  float local_978;
  float local_974;
  undefined8 local_970;
  float local_968;
  undefined8 local_960;
  float local_958;
  undefined8 local_950;
  float local_948;
  undefined8 local_940;
  float local_938;
  undefined8 local_930;
  float local_928;
  undefined8 local_920;
  float local_918;
  undefined8 local_910;
  float local_908;
  undefined8 local_900;
  float local_8f8;
  undefined8 local_8f0;
  float local_8e8;
  undefined8 local_8e0;
  float local_8d8;
  undefined8 local_8d0;
  float local_8c8;
  undefined8 local_8c0;
  float local_8b8;
  undefined8 local_8b0;
  float local_8a8;
  undefined8 local_8a0;
  float local_898;
  undefined8 local_890;
  float local_888;
  undefined8 local_880;
  float local_878;
  undefined8 local_870;
  float local_868;
  undefined8 local_860;
  float local_858;
  undefined8 local_850;
  float local_848;
  undefined8 local_840;
  float local_838;
  undefined8 local_830;
  float local_828;
  undefined8 local_820;
  float local_818;
  undefined8 local_810;
  float local_808;
  undefined8 local_800;
  float local_7f8;
  undefined8 local_7f0;
  float local_7e8;
  undefined8 local_7e0;
  float local_7d8;
  undefined8 local_7d0;
  float local_7c8;
  undefined8 local_7c0;
  float local_7b8;
  undefined8 local_7b0;
  float local_7a8;
  undefined8 local_7a0;
  float local_798;
  undefined8 local_790;
  float local_788;
  undefined8 local_780;
  float local_778;
  undefined8 local_770;
  float local_768;
  undefined8 local_760;
  float local_758;
  float local_754;
  undefined8 local_750;
  float local_748;
  undefined8 local_740;
  float local_738;
  undefined8 local_730;
  float local_728;
  undefined8 local_720;
  float local_718;
  float local_714;
  undefined8 local_710;
  float local_708;
  undefined8 local_700;
  float local_6f8;
  undefined8 local_6f0;
  float local_6e8;
  undefined8 local_6e0;
  float local_6d8;
  undefined8 local_6d0;
  float local_6c8;
  undefined8 local_6c0;
  float local_6b8;
  undefined8 local_6b0;
  float local_6a8;
  undefined8 local_6a0;
  float local_698;
  undefined8 local_690;
  float local_688;
  undefined8 local_680;
  float local_678;
  undefined8 local_670;
  float local_668;
  undefined8 local_660;
  float local_658;
  undefined8 local_650;
  float local_648;
  undefined8 local_640;
  float local_638;
  undefined8 local_630;
  float local_628;
  undefined8 local_620;
  float local_618;
  undefined8 local_610;
  float local_608;
  undefined8 local_600;
  float local_5f8;
  undefined8 local_5f0;
  float local_5e8;
  undefined8 local_5e0;
  float local_5d8;
  float local_5d0;
  float local_5cc;
  undefined8 local_5c8;
  float local_5c0;
  undefined8 local_5b8;
  float local_5b0;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  float local_590;
  float local_58c;
  float local_588;
  float local_584;
  float local_580;
  float local_57c;
  float local_578;
  float local_574;
  Float local_570;
  Float local_56c;
  undefined8 local_568;
  float local_560;
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  float local_540;
  undefined8 local_538;
  float local_530;
  undefined8 local_528;
  float local_520;
  Float local_51c;
  undefined8 local_518;
  float local_510;
  undefined8 local_508;
  float local_500;
  undefined8 local_4f8;
  float local_4f0;
  undefined8 local_4e8;
  float local_4e0;
  undefined8 local_4d8;
  float local_4d0;
  Float local_4cc;
  undefined8 local_4c8;
  float local_4c0;
  undefined8 local_4b8;
  float local_4b0;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  Float local_47c;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined4 local_17c;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  float local_158;
  undefined4 local_154;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  float local_130;
  undefined4 local_12c;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  float local_10c;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_58;
  float local_50;
  float *local_48;
  array<pbrt::Point3<float>,_3> *local_40;
  Tuple2<pbrt::Point2,_float> local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined4 local_18;
  array<float,_3> local_14;
  undefined1 auVar16 [64];
  undefined8 uVar54;
  float fVar55;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffff4a0 >> 0x20);
  level_00 = (LogLevel)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
  local_30 = vmovlpd_avx(in_ZMM0._0_16_);
  local_38 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM2._0_16_);
  if (in_RSI != (float *)0x0) {
    *in_RSI = 0.0;
  }
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_20 = local_30;
  local_18 = in_XMM1_Da;
  pstd::array<pbrt::Point3<float>,_3>::operator[](in_RDI,0);
  local_60 = local_18;
  local_68 = local_20;
  local_70 = local_18;
  local_78 = local_20;
  auVar45 = ZEXT856(0);
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff464;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff460;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff468;
  VVar46 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448)
                      ,p_00);
  local_80 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar45;
  local_88 = vmovlpd_avx(auVar16._0_16_);
  local_58 = local_88;
  local_50 = local_80;
  pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,1);
  local_a0 = local_18;
  local_a8 = local_20;
  local_b0 = local_18;
  local_b8 = local_20;
  auVar45 = ZEXT856(0);
  p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff464;
  p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff460;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff468;
  VVar46 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448)
                      ,p_01);
  local_c0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar45;
  local_c8 = vmovlpd_avx(auVar17._0_16_);
  local_98 = local_c8;
  local_90 = local_c0;
  pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,2);
  local_e0 = local_18;
  local_e8 = local_20;
  local_f0 = local_18;
  local_f8 = local_20;
  auVar45 = ZEXT856(0);
  p_02.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff464;
  p_02.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff460;
  p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff468;
  VVar46 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448)
                      ,p_02);
  local_100 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar45;
  local_108 = vmovlpd_avx(auVar18._0_16_);
  local_110 = local_50;
  local_118 = local_58;
  local_120 = local_50;
  local_128 = local_58;
  VVar46.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff450;
  VVar46.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff44c;
  VVar46.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff454;
  local_d8 = local_108;
  local_d0 = local_100;
  local_10c = LengthSquared<float>(VVar46);
  local_12c = 0;
  if (local_10c <= 0.0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
              (level_00,in_stack_fffffffffffff4a8,level,in_stack_fffffffffffff498,
               (char (*) [17])CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               (char (*) [17])CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               (float *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4d8);
  }
  local_138 = local_90;
  local_140 = local_98;
  local_148 = local_90;
  local_150 = local_98;
  v_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff450;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff44c;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff454;
  local_130 = LengthSquared<float>(v_00);
  local_154 = 0;
  if (local_130 <= 0.0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
              (level_00,in_stack_fffffffffffff4a8,level,in_stack_fffffffffffff498,
               (char (*) [17])CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               (char (*) [17])CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               (float *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4d8);
  }
  local_160 = local_d0;
  local_168 = local_d8;
  local_170 = local_d0;
  local_178 = local_d8;
  v_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff450;
  v_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff44c;
  v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff454;
  local_158 = LengthSquared<float>(v_01);
  local_17c = 0;
  if (local_158 <= 0.0) {
    LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
              (level_00,in_stack_fffffffffffff4a8,level,in_stack_fffffffffffff498,
               (char (*) [17])CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               (char (*) [17])CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0),
               (float *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4d8);
  }
  local_190 = local_50;
  local_198 = local_58;
  local_1a0 = local_50;
  local_1a8 = local_58;
  auVar45 = ZEXT856(0);
  v_12.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
  v_12.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
  v_12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
  VVar46 = Normalize<float>(v_12);
  local_1b0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar45;
  local_1b8 = vmovlpd_avx(auVar19._0_16_);
  local_1d0 = local_90;
  local_1d8 = local_98;
  local_1e0 = local_90;
  local_1e8 = local_98;
  auVar45 = ZEXT856(0);
  v_13.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
  v_13.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
  v_13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
  local_188 = local_1b8;
  local_180 = local_1b0;
  local_58 = local_1b8;
  local_50 = local_1b0;
  VVar46 = Normalize<float>(v_13);
  local_1f0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar45;
  local_1f8 = vmovlpd_avx(auVar20._0_16_);
  local_210 = local_d0;
  local_218 = local_d8;
  local_220 = local_d0;
  local_228 = local_d8;
  auVar45 = ZEXT856(0);
  v_14.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
  v_14.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
  v_14.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
  local_1c8 = local_1f8;
  local_1c0 = local_1f0;
  local_98 = local_1f8;
  local_90 = local_1f0;
  VVar46 = Normalize<float>(v_14);
  local_230 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar45;
  local_238 = vmovlpd_avx(auVar21._0_16_);
  local_250 = local_50;
  local_258 = local_58;
  local_260 = local_90;
  local_268 = local_98;
  local_270 = local_50;
  local_278 = local_58;
  auVar45 = ZEXT856(0);
  local_280 = local_90;
  local_288 = local_98;
  v_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff484;
  v_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff480;
  v_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff488;
  w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff468;
  w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff464;
  w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff46c;
  local_208 = local_238;
  local_200 = local_230;
  local_d8 = local_238;
  local_d0 = local_230;
  VVar46 = Cross<float>(v_07,w_00);
  local_290 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar45;
  local_298 = vmovlpd_avx(auVar22._0_16_);
  local_2b0 = local_90;
  local_2b8 = local_98;
  local_2c0 = local_d0;
  local_2c8 = local_d8;
  local_2d0 = local_90;
  local_2d8 = local_98;
  auVar45 = ZEXT856(0);
  local_2e0 = local_d0;
  local_2e8 = local_d8;
  v_08.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff484;
  v_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff480;
  v_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff488;
  w_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff468;
  w_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff464;
  w_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff46c;
  local_248 = local_298;
  local_240 = local_290;
  VVar46 = Cross<float>(v_08,w_01);
  local_2f0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar45;
  local_2f8 = vmovlpd_avx(auVar23._0_16_);
  local_310 = local_d0;
  local_318 = local_d8;
  local_320 = local_50;
  local_328 = local_58;
  local_330 = local_d0;
  local_338 = local_d8;
  auVar45 = ZEXT856(0);
  local_340 = local_50;
  local_348 = local_58;
  v_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff484;
  v_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff480;
  v_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff488;
  w_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff468;
  w_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff464;
  w_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff46c;
  local_2a8 = local_2f8;
  local_2a0 = local_2f0;
  VVar46 = Cross<float>(v_09,w_02);
  local_350 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar45;
  local_358 = vmovlpd_avx(auVar24._0_16_);
  local_360 = local_240;
  local_368 = local_248;
  local_370 = local_240;
  local_378 = local_248;
  v_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff450;
  v_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff44c;
  v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff454;
  local_308 = local_358;
  local_300 = local_350;
  fVar9 = LengthSquared<float>(v_02);
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    local_380 = local_2a0;
    local_388 = local_2a8;
    local_390 = local_2a0;
    local_398 = local_2a8;
    v_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff450;
    v_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff44c;
    v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff454;
    fVar9 = LengthSquared<float>(v_03);
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      local_3a0 = local_300;
      local_3a8 = local_308;
      local_3b0 = local_300;
      local_3b8 = local_308;
      v_04.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff450;
      v_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff44c;
      v_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff454;
      fVar9 = LengthSquared<float>(v_04);
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        local_3d0 = local_240;
        local_3d8 = local_248;
        local_3e0 = local_240;
        local_3e8 = local_248;
        auVar45 = ZEXT856(0);
        v_15.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
        v_15.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
        v_15.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
        VVar46 = Normalize<float>(v_15);
        local_3f0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar25._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar25._8_56_ = auVar45;
        local_3f8 = vmovlpd_avx(auVar25._0_16_);
        local_410 = local_2a0;
        local_418 = local_2a8;
        local_420 = local_2a0;
        local_428 = local_2a8;
        auVar45 = ZEXT856(0);
        v_16.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
        v_16.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
        v_16.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
        local_3c8 = local_3f8;
        local_3c0 = local_3f0;
        local_248 = local_3f8;
        local_240 = local_3f0;
        VVar46 = Normalize<float>(v_16);
        local_430 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar26._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar26._8_56_ = auVar45;
        local_438 = vmovlpd_avx(auVar26._0_16_);
        local_450 = local_300;
        local_458 = local_308;
        local_460 = local_300;
        local_468 = local_308;
        auVar45 = ZEXT856(0);
        v_17.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
        v_17.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
        v_17.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
        local_408 = local_438;
        local_400 = local_430;
        local_2a8 = local_438;
        local_2a0 = local_430;
        VVar46 = Normalize<float>(v_17);
        local_470 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar27._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar27._8_56_ = auVar45;
        local_478 = vmovlpd_avx(auVar27._0_16_);
        local_480 = local_240;
        local_488 = local_248;
        local_448 = local_478;
        local_440 = local_470;
        local_308 = local_478;
        local_300 = local_470;
        VVar46 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffff440);
        local_4c0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar28._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar28._8_56_ = auVar45;
        local_4c8 = vmovlpd_avx(auVar28._0_16_);
        local_4b0 = local_480;
        local_4b8 = local_488;
        v1.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff550;
        v1.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff548;
        v1.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff548 >> 0x20);
        v2.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff530;
        v2.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff528;
        v2.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff528 >> 0x20);
        local_4a8 = local_4c8;
        local_4a0 = local_4c0;
        local_498 = local_4c8;
        local_490 = local_4c0;
        local_47c = AngleBetween<float>(v1,v2);
        local_4d0 = local_2a0;
        local_4d8 = local_2a8;
        auVar45 = extraout_var;
        VVar46 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffff440);
        local_510 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar29._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar29._8_56_ = auVar45;
        local_518 = vmovlpd_avx(auVar29._0_16_);
        local_500 = local_4d0;
        local_508 = local_4d8;
        v1_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff550;
        v1_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff548;
        v1_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff548 >> 0x20);
        v2_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff530;
        v2_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff528;
        v2_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff528 >> 0x20);
        local_4f8 = local_518;
        local_4f0 = local_510;
        local_4e8 = local_518;
        local_4e0 = local_510;
        local_4cc = AngleBetween<float>(v1_00,v2_00);
        local_520 = local_300;
        local_528 = local_308;
        auVar45 = extraout_var_00;
        VVar46 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffff440);
        local_560 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar30._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar30._8_56_ = auVar45;
        local_568 = vmovlpd_avx(auVar30._0_16_);
        local_550 = local_520;
        local_558 = local_528;
        v1_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff550;
        v1_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff548;
        v1_01.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff548 >> 0x20);
        v2_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff530;
        v2_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff528;
        v2_01.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff528 >> 0x20);
        local_548 = local_568;
        local_540 = local_560;
        local_538 = local_568;
        local_530 = local_560;
        local_51c = AngleBetween<float>(v1_01,v2_01);
        local_56c = local_47c + local_4cc + local_51c;
        pfVar7 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,0);
        local_570 = Lerp(*pfVar7,3.1415927,local_56c);
        if (local_48 != (float *)0x0) {
          local_574 = local_56c - 3.1415927;
          if (0.0 < local_574) {
            fVar9 = 1.0 / local_574;
          }
          else {
            fVar9 = 0.0;
          }
          *local_48 = fVar9;
        }
        dVar14 = std::cos((double)(ulong)(uint)local_47c);
        local_578 = SUB84(dVar14,0);
        dVar14 = std::sin((double)(ulong)(uint)local_47c);
        local_57c = SUB84(dVar14,0);
        dVar14 = std::sin((double)(ulong)(uint)local_570);
        fVar9 = SUB84(dVar14,0) * local_578;
        dVar14 = std::cos((double)(ulong)(uint)local_570);
        local_580 = fVar9 - SUB84(dVar14,0) * local_57c;
        dVar14 = std::cos((double)(ulong)(uint)local_570);
        fVar9 = SUB84(dVar14,0) * local_578;
        dVar14 = std::sin((double)(ulong)(uint)local_570);
        local_584 = fVar9 + SUB84(dVar14,0) * local_57c;
        local_588 = local_584 + local_578;
        local_590 = local_50;
        local_598 = local_58;
        local_5a0 = local_90;
        local_5a8 = local_98;
        local_5b0 = local_50;
        local_5b8 = local_58;
        v_26.super_Tuple3<pbrt::Vector3,_float>.z = local_50;
        v_26.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_58;
        v_26.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_58._4_4_;
        local_5c0 = local_90;
        local_5c8 = local_98;
        w_11.super_Tuple3<pbrt::Vector3,_float>.z = local_90;
        w_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
        w_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
        fVar11 = local_57c;
        fVar9 = local_580;
        fVar10 = Dot<float>(v_26,w_11);
        fVar9 = fVar9 - fVar11 * fVar10;
        local_58c = fVar9;
        fVar11 = DifferenceOfProducts<float,float,float,float>
                           (in_stack_fffffffffffff454,in_stack_fffffffffffff450,
                            in_stack_fffffffffffff44c,in_stack_fffffffffffff448);
        fVar9 = fVar9 + fVar11 * local_578;
        fVar11 = SumOfProducts<float,float,float,float>
                           (in_stack_fffffffffffff454,in_stack_fffffffffffff450,
                            in_stack_fffffffffffff44c,in_stack_fffffffffffff448);
        local_5cc = fVar9 / (fVar11 * local_57c);
        eVar5 = IsNaN<float>(0.0);
        if (eVar5) {
          LogFatal<char_const(&)[14]>
                    (level,in_stack_fffffffffffff498,in_stack_fffffffffffff494,
                     (char *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                     (char (*) [14])CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
        }
        i = 1;
        local_5cc = Clamp<float,int,int>(local_5cc,-1,1);
        Sqr<float>(local_5cc);
        fVar52 = 1.0;
        local_5d0 = SafeSqrt(0.0);
        auVar45 = (undefined1  [56])0x0;
        local_5f8 = local_50;
        local_600 = local_58;
        local_608 = local_50;
        local_610 = local_58;
        t.y = in_stack_fffffffffffff46c;
        t.x = in_stack_fffffffffffff468;
        t.z = in_stack_fffffffffffff470;
        VVar46 = operator*(in_stack_fffffffffffff454,t);
        local_618 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar31._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar31._8_56_ = auVar45;
        local_620 = vmovlpd_avx(auVar31._0_16_);
        local_668 = local_d0;
        local_670 = local_d8;
        local_678 = local_50;
        local_680 = local_58;
        local_688 = local_d0;
        local_690 = local_d8;
        auVar45 = ZEXT856(0);
        local_698 = local_50;
        local_6a0 = local_58;
        v_20.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff520;
        v_20.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff518;
        v_20.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff518 >> 0x20);
        w_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff500;
        w_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff4f8;
        w_05.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
        fVar11 = local_5d0;
        local_5f0 = local_620;
        local_5e8 = local_618;
        VVar46 = GramSchmidt<float>(v_20,w_05);
        local_6b8 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar32._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar32._8_56_ = auVar45;
        local_6c0 = vmovlpd_avx(auVar32._0_16_);
        uVar44 = 0;
        v_18.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
        v_18.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
        v_18.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
        local_6b0 = local_6c0;
        local_6a8 = local_6b8;
        local_660 = local_6c0;
        local_658 = local_6b8;
        VVar46 = Normalize<float>(v_18);
        local_6d8 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar15 = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar45 = (undefined1  [56])0x0;
        fVar48 = VVar46.super_Tuple3<pbrt::Vector3,_float>.x;
        fVar49 = VVar46.super_Tuple3<pbrt::Vector3,_float>.y;
        fVar50 = (float)uVar44;
        uVar51 = (undefined4)((ulong)uVar44 >> 0x20);
        auVar1._8_4_ = fVar50;
        auVar1._0_8_ = uVar15;
        auVar1._12_4_ = uVar51;
        local_6e0 = vmovlpd_avx(auVar1);
        t_00.z = fVar50;
        t_00.x = (float)(int)uVar15;
        t_00.y = (float)(int)((ulong)uVar15 >> 0x20);
        local_6d0 = local_6e0;
        local_6c8 = local_6d8;
        local_650 = local_6e0;
        local_648 = local_6d8;
        local_640 = local_6e0;
        local_638 = local_6d8;
        VVar46 = operator*(in_stack_fffffffffffff454,t_00);
        local_6f8 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar33._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar33._8_56_ = auVar45;
        local_700 = vmovlpd_avx(auVar33._0_16_);
        auVar45 = ZEXT856(0);
        c_00.super_Tuple3<pbrt::Vector3,_float>.y = fVar11;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff460;
        c_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar48;
        local_6f0 = local_700;
        local_6e8 = local_6f8;
        local_630 = local_700;
        local_628 = local_6f8;
        VVar46 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),c_00);
        local_708 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar34._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar34._8_56_ = auVar45;
        local_710 = vmovlpd_avx(auVar34._0_16_);
        local_5e0 = local_710;
        local_5d8 = local_708;
        pfVar7 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,i);
        fVar9 = *pfVar7;
        local_718 = local_5d8;
        local_720 = local_5e0;
        local_728 = local_90;
        local_730 = local_98;
        local_738 = local_5d8;
        local_740 = local_5e0;
        v_25.super_Tuple3<pbrt::Vector3,_float>.z = local_5d8;
        v_25.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_5e0;
        v_25.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_5e0._4_4_;
        local_748 = local_90;
        local_750 = local_98;
        w_10.super_Tuple3<pbrt::Vector3,_float>.z = local_90;
        w_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
        w_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
        fVar10 = Dot<float>(v_25,w_10);
        local_714 = fVar52 - fVar9 * (fVar52 - fVar10);
        Sqr<float>(local_714);
        local_754 = SafeSqrt(0.0);
        auVar45 = (undefined1  [56])0x0;
        local_778 = local_90;
        local_780 = local_98;
        local_788 = local_90;
        local_790 = local_98;
        t_01.y = fVar49;
        t_01.x = fVar48;
        t_01.z = fVar50;
        VVar46 = operator*(in_stack_fffffffffffff454,t_01);
        local_798 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar35._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar35._8_56_ = auVar45;
        local_7a0 = vmovlpd_avx(auVar35._0_16_);
        local_7e8 = local_5d8;
        local_7f0 = local_5e0;
        local_7f8 = local_90;
        local_800 = local_98;
        local_808 = local_5d8;
        local_810 = local_5e0;
        auVar45 = ZEXT856(0);
        local_818 = local_90;
        local_820 = local_98;
        v_21.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff520;
        v_21.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff518;
        v_21.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff518 >> 0x20);
        w_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff500;
        w_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff4f8;
        w_06.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
        fVar10 = local_754;
        local_770 = local_7a0;
        local_768 = local_798;
        VVar46 = GramSchmidt<float>(v_21,w_06);
        local_838 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar36._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar36._8_56_ = auVar45;
        local_840 = vmovlpd_avx(auVar36._0_16_);
        uVar15 = 0;
        v_19.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff48c;
        v_19.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff488;
        v_19.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff490;
        local_830 = local_840;
        local_828 = local_838;
        local_7e0 = local_840;
        local_7d8 = local_838;
        VVar46 = Normalize<float>(v_19);
        local_858 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar45 = (undefined1  [56])0x0;
        fVar53 = VVar46.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar2._8_4_ = (int)uVar15;
        auVar2._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar2._12_4_ = (int)((ulong)uVar15 >> 0x20);
        local_860 = vmovlpd_avx(auVar2);
        t_02.y = fVar49;
        t_02.x = fVar48;
        t_02.z = fVar50;
        local_850 = local_860;
        local_848 = local_858;
        local_7d0 = local_860;
        local_7c8 = local_858;
        local_7c0 = local_860;
        local_7b8 = local_858;
        VVar46 = operator*(in_stack_fffffffffffff454,t_02);
        local_878 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar37._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar37._8_56_ = auVar45;
        local_880 = vmovlpd_avx(auVar37._0_16_);
        auVar45 = ZEXT856(0);
        c_01.super_Tuple3<pbrt::Vector3,_float>.y = fVar11;
        c_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff460;
        c_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar48;
        local_870 = local_880;
        local_868 = local_878;
        local_7b0 = local_880;
        local_7a8 = local_878;
        VVar46 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),c_01);
        local_888 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar38._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar38._8_56_ = auVar45;
        local_890 = vmovlpd_avx(auVar38._0_16_);
        local_760 = local_890;
        local_758 = local_888;
        pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,1);
        i_00 = 0;
        pPVar8 = pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,0);
        local_8b8 = (pPVar8->super_Tuple3<pbrt::Point3,_float>).z;
        local_8c0._0_4_ = (pPVar8->super_Tuple3<pbrt::Point3,_float>).x;
        local_8c0._4_4_ = (pPVar8->super_Tuple3<pbrt::Point3,_float>).y;
        auVar45 = ZEXT856(0);
        p_03.super_Tuple3<pbrt::Point3,_float>.y = fVar11;
        p_03.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff460;
        p_03.super_Tuple3<pbrt::Point3,_float>.z = fVar48;
        local_8b0 = local_8c0;
        local_8a8 = local_8b8;
        VVar46 = Point3<float>::operator-
                           ((Point3<float> *)
                            CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),p_03);
        local_8c8 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar39._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar39._8_56_ = auVar45;
        local_8d0 = vmovlpd_avx(auVar39._0_16_);
        local_8a0 = local_8d0;
        local_898 = local_8c8;
        pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,2);
        pPVar8 = pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,i_00);
        local_8f8 = (pPVar8->super_Tuple3<pbrt::Point3,_float>).z;
        local_900._0_4_ = (pPVar8->super_Tuple3<pbrt::Point3,_float>).x;
        local_900._4_4_ = (pPVar8->super_Tuple3<pbrt::Point3,_float>).y;
        auVar45 = ZEXT856(0);
        p_04.super_Tuple3<pbrt::Point3,_float>.y = fVar11;
        p_04.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff460;
        p_04.super_Tuple3<pbrt::Point3,_float>.z = fVar48;
        local_8f0 = local_900;
        local_8e8 = local_8f8;
        VVar46 = Point3<float>::operator-
                           ((Point3<float> *)
                            CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),p_04);
        local_958 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar40._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar40._8_56_ = auVar45;
        local_960 = vmovlpd_avx(auVar40._0_16_);
        local_928 = local_758;
        local_930 = local_760;
        local_948 = local_758;
        local_950 = local_760;
        auVar45 = ZEXT856(0);
        v_10.super_Tuple3<pbrt::Vector3,_float>.y = fVar10;
        v_10.super_Tuple3<pbrt::Vector3,_float>.x = fVar52;
        v_10.super_Tuple3<pbrt::Vector3,_float>.z = fVar53;
        w_03.super_Tuple3<pbrt::Vector3,_float>.y = fVar48;
        w_03.super_Tuple3<pbrt::Vector3,_float>.x = fVar11;
        w_03.super_Tuple3<pbrt::Vector3,_float>.z = fVar49;
        local_940 = local_960;
        local_938 = local_958;
        local_910 = local_960;
        local_908 = local_958;
        local_8e0 = local_960;
        local_8d8 = local_958;
        VVar46 = Cross<float>(v_10,w_03);
        local_998 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar41._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar41._8_56_ = auVar45;
        local_9a0 = vmovlpd_avx(auVar41._0_16_);
        local_988 = local_898;
        local_990 = local_8a0;
        v_24.super_Tuple3<pbrt::Vector3,_float>.z = local_998;
        v_24.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_9a0;
        v_24.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_9a0 >> 0x20);
        local_9a8 = local_898;
        local_9b0 = local_8a0;
        w_09.super_Tuple3<pbrt::Vector3,_float>.z = local_898;
        w_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_8a0;
        w_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_8a0._4_4_;
        local_980 = local_9a0;
        local_978 = local_998;
        local_970 = local_9a0;
        local_968 = local_998;
        local_920 = local_9a0;
        local_918 = local_998;
        local_974 = Dot<float>(v_24,w_09);
        if ((SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>,pbrt::Point2<float>,float*)
             ::reg == '\0') &&
           (iVar6 = __cxa_guard_acquire(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>,pbrt::Point2<float>,float*)
                                         ::reg), iVar6 != 0)) {
          SampleSphericalTriangle(pstd::array_const&,pbrt::Point3,pbrt::Point2,float*)::$_0::
          operator_cast_to_function_pointer(&local_9b1);
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)CONCAT44(uVar51,fVar50),(AccumFunc)CONCAT44(fVar49,fVar48),
                     (PixelAccumFunc)CONCAT44(fVar11,in_stack_fffffffffffff460));
          __cxa_guard_release(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>,pbrt::Point2<float>,float*)
                               ::reg);
        }
        *(long *)(*in_FS_OFFSET + -0x360) = *(long *)(*in_FS_OFFSET + -0x360) + 1;
        if ((local_974 == 0.0) && (!NAN(local_974))) {
          *(long *)(*in_FS_OFFSET + -0x368) = *(long *)(*in_FS_OFFSET + -0x368) + 1;
        }
        if ((local_974 != 0.0) || (NAN(local_974))) {
          fVar12 = 1.0 / local_974;
          pstd::array<pbrt::Point3<float>,_3>::operator[](local_40,0);
          auVar45 = ZEXT856(0);
          p_05.super_Tuple3<pbrt::Point3,_float>.y = fVar11;
          p_05.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff460;
          p_05.super_Tuple3<pbrt::Point3,_float>.z = fVar48;
          VVar46 = Point3<float>::operator-
                             ((Point3<float> *)
                              CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),p_05);
          auVar42._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar42._8_56_ = auVar45;
          uVar15 = vmovlpd_avx(auVar42._0_16_);
          v_23.super_Tuple3<pbrt::Vector3,_float>.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
          v_23.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
          v_23.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
          w_08.super_Tuple3<pbrt::Vector3,_float>.z = local_918;
          w_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_920;
          w_08.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_920._4_4_;
          fVar13 = Dot<float>(v_23,w_08);
          fVar4 = local_758;
          uVar44 = local_760;
          auVar45 = ZEXT856(0);
          v_11.super_Tuple3<pbrt::Vector3,_float>.y = fVar10;
          v_11.super_Tuple3<pbrt::Vector3,_float>.x = fVar52;
          v_11.super_Tuple3<pbrt::Vector3,_float>.z = fVar53;
          w_04.super_Tuple3<pbrt::Vector3,_float>.y = fVar48;
          w_04.super_Tuple3<pbrt::Vector3,_float>.x = fVar11;
          w_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar49;
          VVar46 = Cross<float>(v_11,w_04);
          uVar3 = local_760;
          auVar43._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar43._8_56_ = auVar45;
          uVar15 = vmovlpd_avx(auVar43._0_16_);
          v_22.super_Tuple3<pbrt::Vector3,_float>.z = fVar4;
          local_760._0_4_ = (undefined4)uVar44;
          local_760._4_4_ = SUB84(uVar44,4);
          v_22.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_760;
          v_22.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_760._4_4_;
          w_07.super_Tuple3<pbrt::Vector3,_float>.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
          w_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
          w_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
          local_760 = uVar3;
          fVar11 = Dot<float>(v_22,w_07);
          Clamp<float,int,int>(fVar13 * fVar12,0,1);
          Clamp<float,int,int>(fVar11 * fVar12,0,1);
          v_06._M_array._4_4_ = fVar9;
          v_06._M_array._0_4_ = i;
          v_06._M_len._0_4_ = fVar52;
          v_06._M_len._4_4_ = fVar10;
          pstd::array<float,_3>::array((array<float,_3> *)CONCAT44(uVar51,fVar50),v_06);
        }
        else {
          local_9e4 = 0x3eaaaaab;
          local_9e0 = 0x3eaaaaab;
          local_9dc = 0x3eaaaaab;
          local_9d8 = &local_9e4;
          local_9d0 = 3;
          v_05._M_array._4_4_ = fVar9;
          v_05._M_array._0_4_ = i;
          v_05._M_len._0_4_ = fVar52;
          v_05._M_len._4_4_ = fVar10;
          pstd::array<float,_3>::array((array<float,_3> *)CONCAT44(uVar51,fVar50),v_05);
        }
        goto LAB_005cde2e;
      }
    }
  }
  memset(&local_14,0,0xc);
  pstd::array<float,_3>::array(&local_14);
LAB_005cde2e:
  aVar47.values[0] = local_14.values[0];
  uVar54._4_4_ = local_14.values[1];
  register0x00001240 = local_14.values[2];
  return (array<float,_3>)aVar47.values;
}

Assistant:

PBRT_CPU_GPU pstd::array<Float, 3> SampleSphericalTriangle(const pstd::array<Point3f, 3> &v, Point3f p,
                                              Point2f u, Float *pdf) {
    if (pdf)
        *pdf = 0;
    // Compute vectors _a_, _b_, and _c_ to spherical triangle vertices
    Vector3f a(v[0] - p), b(v[1] - p), c(v[2] - p);
    CHECK_GT(LengthSquared(a), 0);
    CHECK_GT(LengthSquared(b), 0);
    CHECK_GT(LengthSquared(c), 0);
    a = Normalize(a);
    b = Normalize(b);
    c = Normalize(c);

    // Compute normalized cross products of all direction pairs
    Vector3f n_ab = Cross(a, b), n_bc = Cross(b, c), n_ca = Cross(c, a);
    if (LengthSquared(n_ab) == 0 || LengthSquared(n_bc) == 0 || LengthSquared(n_ca) == 0)
        return {};
    n_ab = Normalize(n_ab);
    n_bc = Normalize(n_bc);
    n_ca = Normalize(n_ca);

    // Find angles $\alpha$, $\beta$, and $\gamma$ at spherical triangle vertices
    Float alpha = AngleBetween(n_ab, -n_ca);
    Float beta = AngleBetween(n_bc, -n_ab);
    Float gamma = AngleBetween(n_ca, -n_bc);

    // Uniformly sample triangle area $A$ to compute $A'$
    Float A_pi = alpha + beta + gamma;
    Float Ap_pi = Lerp(u[0], Pi, A_pi);
    if (pdf) {
        Float A = A_pi - Pi;
        *pdf = (A <= 0) ? 0 : 1 / A;
    }

    // Find $\cos\beta'$ for point along _b_ for sampled area
    Float cosAlpha = std::cos(alpha), sinAlpha = std::sin(alpha);
    Float sinPhi = std::sin(Ap_pi) * cosAlpha - std::cos(Ap_pi) * sinAlpha;
    Float cosPhi = std::cos(Ap_pi) * cosAlpha + std::sin(Ap_pi) * sinAlpha;
    Float k1 = cosPhi + cosAlpha;
    Float k2 = sinPhi - sinAlpha * Dot(a, b) /* cos c */;
    Float cosBp = (k2 + (DifferenceOfProducts(k2, cosPhi, k1, sinPhi)) * cosAlpha) /
                  ((SumOfProducts(k2, sinPhi, k1, cosPhi)) * sinAlpha);
    // Happens if the triangle basically covers the entire hemisphere.
    // We currently depend on calling code to detect this case, which
    // is sort of ugly/unfortunate.
    CHECK(!IsNaN(cosBp));
    cosBp = Clamp(cosBp, -1, 1);

    // Sample $c'$ along the arc between $a$ and $c$
    Float sinBp = SafeSqrt(1 - Sqr(cosBp));
    Vector3f cp = cosBp * a + sinBp * Normalize(GramSchmidt(c, a));

    // Compute sampled spherical triangle direction and return barycentrics
    Float cosTheta = 1 - u[1] * (1 - Dot(cp, b));
    Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
    Vector3f w = cosTheta * b + sinTheta * Normalize(GramSchmidt(cp, b));
    // Find barycentric coordinates for sampled direction _w_
    Vector3f e1 = v[1] - v[0], e2 = v[2] - v[0];
    Vector3f s1 = Cross(w, e2);
    Float divisor = Dot(s1, e1);
    CHECK_RARE(1e-6, divisor == 0);
    if (divisor == 0) {
        // This happens with triangles that cover (nearly) the whole
        // hemisphere.
        return {1.f / 3.f, 1.f / 3.f, 1.f / 3.f};
    }
    Float invDivisor = 1 / divisor;
    Vector3f s = p - v[0];
    Float b1 = Dot(s, s1) * invDivisor;
    Float b2 = Dot(w, Cross(s, e1)) * invDivisor;

    // Return clamped barycentrics for sampled direction
    b1 = Clamp(b1, 0, 1);
    b2 = Clamp(b2, 0, 1);
    if (b1 + b2 > 1) {
        b1 /= b1 + b2;
        b2 /= b1 + b2;
    }
    return {Float(1 - b1 - b2), Float(b1), Float(b2)};
}